

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall TcpSocketImpl::WriteThread(TcpSocketImpl *this)

{
  unsigned_long __n;
  __tuple_element_t<1UL,_tuple<unique_ptr<unsigned_char[],_default_delete<unsigned_char[]>_>,_unsigned_long>_>
  _Var1;
  int iVar2;
  int iVar3;
  memory_order mVar4;
  __int_type _Var5;
  size_type sVar6;
  reference pvVar7;
  __tuple_element_t<1UL,_tuple<unique_ptr<unsigned_char[],_default_delete<unsigned_char[]>_>,_unsigned_long>_>
  *p_Var8;
  __tuple_element_t<0UL,_tuple<unique_ptr<unsigned_char[],_default_delete<unsigned_char[]>_>,_unsigned_long>_>
  *p_Var9;
  type puVar10;
  ulong uVar11;
  type puVar12;
  int *piVar13;
  atomic_uchar *this_00;
  bool bVar14;
  unsigned_long uStack_200;
  uchar cExpected;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_1f8;
  __array tmp_1;
  __array tmp;
  type local_1e0;
  thread local_1d8;
  thread thErrorCb_1;
  int iError;
  uint32_t transferred;
  DATA data;
  thread local_1b0;
  thread thErrorCb;
  socklen_t iLen;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  undefined1 auStack_180 [4];
  uint __i;
  timeval timeout;
  fd_set errorfd;
  fd_set writefd;
  undefined1 local_58 [8];
  unique_lock<std::mutex> lock;
  TcpSocketImpl *this_local;
  bool local_26;
  
  lock._8_8_ = this;
  std::__atomic_base<unsigned_char>::operator&=
            (&(this->super_BaseSocketImpl).m_iShutDownState.super___atomic_base<unsigned_char>,0xfd)
  ;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_58,&(this->super_BaseSocketImpl).m_mxWrite);
LAB_0012e77c:
  do {
    while( true ) {
      bVar14 = true;
      if ((this->m_bCloseReq & 1U) != 0) {
        _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                          ((__atomic_base *)&this->m_atOutBytes);
        bVar14 = _Var5 != 0;
      }
      if (!bVar14) goto LAB_0012f06b;
      if (((this->m_bCloseReq & 1U) == 0) &&
         (_Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                            ((__atomic_base *)&this->m_atOutBytes), _Var5 == 0)) {
        std::condition_variable::wait<TcpSocketImpl::WriteThread()::__0>
                  (&this->m_cv,(unique_lock<std::mutex> *)local_58,(anon_class_8_1_8991fb9c)this);
      }
      if ((this->super_BaseSocketImpl).m_fSock == -1) goto LAB_0012f06b;
      _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base *)&this->m_atOutBytes);
      if (_Var5 != 0) break;
LAB_0012f057:
      if ((this->super_BaseSocketImpl).m_iError != 0) goto LAB_0012f06b;
    }
    memset(errorfd.fds_bits + 0xf,0,0x80);
    memset(&timeout.tv_usec,0,0x80);
    memset(auStack_180,0,0x10);
    _auStack_180 = 1;
    timeout.tv_sec = 0;
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      errorfd.fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
    }
    for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
      errorfd.fds_bits[(ulong)__arr_1._4_4_ - 1] = 0;
    }
    iVar3 = (this->super_BaseSocketImpl).m_fSock;
    iVar2 = iVar3;
    if (iVar3 < 0) {
      iVar2 = iVar3 + 0x3f;
    }
    errorfd.fds_bits[(long)(iVar2 >> 6) + 0xf] =
         errorfd.fds_bits[(long)(iVar2 >> 6) + 0xf] | 1L << ((ulong)(byte)iVar3 & 0x3f);
    iVar3 = (this->super_BaseSocketImpl).m_fSock;
    iVar2 = iVar3;
    if (iVar3 < 0) {
      iVar2 = iVar3 + 0x3f;
    }
    errorfd.fds_bits[(long)(iVar2 >> 6) + -1] =
         errorfd.fds_bits[(long)(iVar2 >> 6) + -1] | 1L << ((ulong)(byte)iVar3 & 0x3f);
    iVar3 = select((this->super_BaseSocketImpl).m_fSock + 1,(fd_set *)0x0,
                   (fd_set *)(errorfd.fds_bits + 0xf),(fd_set *)&timeout.tv_usec,
                   (timeval *)auStack_180);
    if (iVar3 != 0) {
      if ((errorfd.fds_bits[(long)((this->super_BaseSocketImpl).m_fSock / 0x40) + -1] &
          1L << ((byte)((long)(this->super_BaseSocketImpl).m_fSock % 0x40) & 0x3f)) != 0) {
        if ((this->super_BaseSocketImpl).m_iError == 0) {
          thErrorCb._M_id._M_thread._4_4_ = 4;
          getsockopt((this->super_BaseSocketImpl).m_fSock,1,4,&(this->super_BaseSocketImpl).m_iError
                     ,(socklen_t *)((long)&thErrorCb._M_id._M_thread + 4));
          (this->super_BaseSocketImpl).m_iErrLoc = 2;
          std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_58);
          data.
          super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
          .
          super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
          ._M_head_impl._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
               (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)this;
          std::thread::thread<TcpSocketImpl::WriteThread()::__1,,void>
                    (&local_1b0,
                     (type *)&data.
                              super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                              .
                              super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
                    );
          std::thread::join();
          std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_58);
          std::thread::~thread(&local_1b0);
        }
        goto LAB_0012f06b;
      }
      std::mutex::lock(&this->m_mxOutDeque);
      sVar6 = std::
              deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
              ::size(&this->m_quOutData);
      if (sVar6 != 0) {
        pvVar7 = std::
                 deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                 ::front(&this->m_quOutData);
        std::
        tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
        ::tuple((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                 *)&iError,pvVar7);
        std::
        deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
        ::pop_front(&this->m_quOutData);
        p_Var8 = std::
                 get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                           ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                             *)&iError);
        std::__atomic_base<unsigned_long>::operator-=
                  (&(this->m_atOutBytes).super___atomic_base<unsigned_long>,*p_Var8);
        std::mutex::unlock(&this->m_mxOutDeque);
        iVar3 = (this->super_BaseSocketImpl).m_fSock;
        p_Var9 = std::
                 get<0ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                           ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                             *)&iError);
        puVar10 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                  operator[](p_Var9,0);
        p_Var8 = std::
                 get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                           ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                             *)&iError);
        uVar11 = send(iVar3,puVar10,(long)(int)*p_Var8,0);
        thErrorCb_1._M_id._M_thread._4_4_ = (uint)uVar11;
        if ((int)thErrorCb_1._M_id._M_thread._4_4_ < 1) {
          piVar13 = __errno_location();
          thErrorCb_1._M_id._M_thread._0_4_ = *piVar13;
          if ((int)thErrorCb_1._M_id._M_thread == 0xb) {
            std::
            get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                      ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                        *)&iError);
            std::make_unique<unsigned_char[]>((size_t)&tmp_1);
            p_Var9 = std::
                     get<0ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                               ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                                 *)&iError);
            puVar10 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                      operator[](p_Var9,0);
            p_Var8 = std::
                     get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                               ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                                 *)&iError);
            __n = *p_Var8;
            puVar12 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                      operator[](&tmp_1,0);
            std::copy_n<unsigned_char*,unsigned_long,unsigned_char*>(puVar10,__n,puVar12);
            std::mutex::lock(&this->m_mxOutDeque);
            p_Var8 = std::
                     get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                               ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                                 *)&iError);
            std::__atomic_base<unsigned_long>::operator+=
                      (&(this->m_atOutBytes).super___atomic_base<unsigned_long>,*p_Var8);
            p_Var8 = std::
                     get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                               ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                                 *)&iError);
            std::
            deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
            ::
            emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                      ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                        *)&this->m_quOutData,&tmp_1,p_Var8);
            std::mutex::unlock(&this->m_mxOutDeque);
            std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                      (&tmp_1);
            goto LAB_0012f020;
          }
          (this->super_BaseSocketImpl).m_iError = (int)thErrorCb_1._M_id._M_thread;
          (this->super_BaseSocketImpl).m_iErrLoc = 3;
          std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_58);
          local_1e0.this = this;
          std::thread::thread<TcpSocketImpl::WriteThread()::__2,,void>(&local_1d8,&local_1e0);
          std::thread::join();
          std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_58);
          tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ = 3;
          std::thread::~thread(&local_1d8);
        }
        else {
          p_Var8 = std::
                   get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                             ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                               *)&iError);
          if ((uVar11 & 0xffffffff) < *p_Var8) {
            std::
            get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                      ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                        *)&iError);
            std::make_unique<unsigned_char[]>((size_t)&local_1f8);
            p_Var9 = std::
                     get<0ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                               ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                                 *)&iError);
            puVar10 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                      operator[](p_Var9,(ulong)thErrorCb_1._M_id._M_thread._4_4_);
            p_Var8 = std::
                     get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                               ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                                 *)&iError);
            _Var1 = *p_Var8;
            uVar11 = (ulong)thErrorCb_1._M_id._M_thread._4_4_;
            puVar12 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                      operator[](&local_1f8,0);
            std::copy_n<unsigned_char*,unsigned_long,unsigned_char*>(puVar10,_Var1 - uVar11,puVar12)
            ;
            std::mutex::lock(&this->m_mxOutDeque);
            p_Var8 = std::
                     get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                               ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                                 *)&iError);
            std::__atomic_base<unsigned_long>::operator+=
                      (&(this->m_atOutBytes).super___atomic_base<unsigned_long>,
                       *p_Var8 - (ulong)thErrorCb_1._M_id._M_thread._4_4_);
            p_Var8 = std::
                     get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                               ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                                 *)&iError);
            uStack_200 = *p_Var8 - (ulong)thErrorCb_1._M_id._M_thread._4_4_;
            std::
            deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
            ::
            emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                      ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                        *)&this->m_quOutData,&local_1f8,&stack0xfffffffffffffe00);
            std::mutex::unlock(&this->m_mxOutDeque);
            std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                      (&local_1f8);
          }
LAB_0012f020:
          tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ = 0;
        }
        std::
        tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
        ::~tuple((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                  *)&iError);
        if (tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
            _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ == 0)
        goto LAB_0012f057;
        goto LAB_0012f06b;
      }
      std::__atomic_base<unsigned_long>::operator=
                (&(this->m_atOutBytes).super___atomic_base<unsigned_long>,0);
      std::mutex::unlock(&this->m_mxOutDeque);
      goto LAB_0012e77c;
    }
    if ((this->m_bCloseReq & 1U) != 0) {
LAB_0012f06b:
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_58);
      if ((((this->super_BaseSocketImpl).m_iError == 0) &&
          ((this->super_BaseSocketImpl).m_fSock != -1)) &&
         (iVar3 = shutdown((this->super_BaseSocketImpl).m_fSock,1), iVar3 != 0)) {
        piVar13 = __errno_location();
        (this->super_BaseSocketImpl).m_iError = *piVar13;
        (this->super_BaseSocketImpl).m_iErrLoc = 4;
      }
      this_00 = &(this->super_BaseSocketImpl).m_iShutDownState;
      std::__atomic_base<unsigned_char>::operator|=
                (&this_00->super___atomic_base<unsigned_char>,'\x02');
      mVar4 = std::__cmpexch_failure_order(memory_order_seq_cst);
      switch(0x12f24d) {
      default:
        if (mVar4 - memory_order_consume < 2) {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        else if (mVar4 == memory_order_seq_cst) {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        else {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        break;
      case 2:
        if (mVar4 - memory_order_consume < 2) {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        else if (mVar4 == memory_order_seq_cst) {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        else {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        break;
      case 3:
        if (mVar4 - memory_order_consume < 2) {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        else if (mVar4 == memory_order_seq_cst) {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        else {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        break;
      case 4:
        if (mVar4 - memory_order_consume < 2) {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        else if (mVar4 == memory_order_seq_cst) {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        else {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
      }
      if (local_26) {
        if ((this->super_BaseSocketImpl).m_fSock != -1) {
          close((this->super_BaseSocketImpl).m_fSock);
          (this->super_BaseSocketImpl).m_fSock = -1;
        }
        (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])();
        if ((this->m_pRefServSocket != (TcpServer *)0x0) || ((this->m_bSelfDelete & 1U) == 1)) {
          (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x16])();
        }
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_58);
      return;
    }
  } while( true );
}

Assistant:

void TcpSocketImpl::WriteThread()
{
    m_iShutDownState &= static_cast<uint8_t>(~2);

    unique_lock<mutex> lock(m_mxWrite);

    while (m_bCloseReq == false || m_atOutBytes != 0)
    {
        if (m_bCloseReq == false && m_atOutBytes == 0)
            m_cv.wait(lock, [&]() noexcept { return m_atOutBytes == 0 ? m_bCloseReq : true; });

        if (m_fSock == INVALID_SOCKET)
            break;

        if (m_atOutBytes != 0)
        {
            fd_set writefd{}, errorfd{};
            struct timeval timeout{};

            timeout.tv_sec = 1;
            timeout.tv_usec = 0;
            FD_ZERO(&writefd);
            FD_ZERO(&errorfd);

            FD_SET(m_fSock, &writefd);
            FD_SET(m_fSock, &errorfd);

            if (::select(static_cast<int>(m_fSock + 1), nullptr, &writefd, &errorfd, &timeout) == 0)
            {
                if (m_bCloseReq == false) continue;
                break;
            }

            if (FD_ISSET(m_fSock, &errorfd))
            {
                if (m_iError == 0)
                {
                    socklen_t iLen = sizeof(m_iError);
                    getsockopt(m_fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&m_iError), &iLen);
                    m_iErrLoc = 2;
                    lock.unlock();
                    thread thErrorCb([&]()
                    {
                        if (m_fErrorParam && m_bStop == false)
                            m_fErrorParam(m_pBkRef, m_pvUserData);
                        else if (m_fError && m_bStop == false)
                            m_fError(m_pBkRef);
                    });
                    thErrorCb.join();
                    lock.lock();
                }
                break;
            }

            m_mxOutDeque.lock();
            if (m_quOutData.size() == 0)
            {
                m_atOutBytes = 0;
                m_mxOutDeque.unlock();
                continue;
            }
            DATA data = move(m_quOutData.front());
            m_quOutData.pop_front();
            m_atOutBytes -= BUFLEN(data);
            m_mxOutDeque.unlock();

            const uint32_t transferred = ::send(m_fSock, reinterpret_cast<char*>(&BUFFER(data)[0]), static_cast<int>(BUFLEN(data)), 0);
            if (static_cast<int32_t>(transferred) <= 0)
            {
                const int iError = WSAGetLastError();
                if (iError != WSAEWOULDBLOCK)
                {
                    m_iError = iError;
                    m_iErrLoc = 3;
                    lock.unlock();
                    thread thErrorCb([&]()
                    {
                        if (m_fErrorParam && m_bStop == false)
                            m_fErrorParam(m_pBkRef, m_pvUserData);
                        else if (m_fError && m_bStop == false)
                            m_fError(m_pBkRef);
                    });
                    thErrorCb.join();
                    lock.lock();
                    break;
                }
                // Put the not send bytes back into the que if it is not a SSL connection. A SSL connection has the bytes still available
                auto tmp = make_unique<uint8_t[]>(BUFLEN(data));
                copy_n(&BUFFER(data)[0], BUFLEN(data), &tmp[0]);
                m_mxOutDeque.lock();
                m_atOutBytes += BUFLEN(data);
                m_quOutData.emplace_front(move(tmp), BUFLEN(data));
                m_mxOutDeque.unlock();
            }
            else if (transferred < BUFLEN(data)) // Less bytes send as buffer size, we put the rast back in your que
            {
                auto tmp = make_unique<uint8_t[]>(BUFLEN(data) - transferred);
                copy_n(&BUFFER(data)[transferred], BUFLEN(data) - transferred, &tmp[0]);
                m_mxOutDeque.lock();
                m_atOutBytes += (BUFLEN(data) - transferred);
                m_quOutData.emplace_front(move(tmp), (BUFLEN(data) - transferred));
                m_mxOutDeque.unlock();
            }
        }

        if (m_iError != 0)
            break;
    }

    lock.unlock();

    // if we get out of the while loop, the stop request was send or we have an error
    if (m_iError == 0 && m_fSock != INVALID_SOCKET)
    {
        if (::shutdown(m_fSock, SD_SEND) != 0)
        {
            m_iError = WSAGetLastError();// OutputDebugString(L"Error shutdown socket\r\n");
            m_iErrLoc = 4;
        }
    }
    m_iShutDownState |= 2;

    unsigned char cExpected = 7;
    if (m_iShutDownState.compare_exchange_strong(cExpected, 15) == true)
    {
        if (m_fSock != INVALID_SOCKET)
        {
            ::closesocket(m_fSock);
            m_fSock = INVALID_SOCKET;
        }
        StartClosingCB();

        if (m_pRefServSocket != nullptr || m_bSelfDelete == true)    // Auto-delete, socket created from server socket
            Delete();// thread([&]() { delete this; }).detach();
    }
}